

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O0

void __thiscall helics::EndpointInfo::removeTarget(EndpointInfo *this,GlobalHandle targetId)

{
  bool bVar1;
  iterator __last;
  undefined8 in_RSI;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *in_RDI;
  __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  removeIterator_1;
  EndpointInformation *targetInfo;
  iterator __end3;
  iterator __begin3;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *__range3;
  __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  removeIterator;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
  *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *this_00;
  GlobalHandle *__args;
  GlobalHandle in_stack_ffffffffffffff48;
  __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  in_stack_ffffffffffffff50;
  const_iterator in_stack_ffffffffffffff58;
  __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  local_68;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *local_60;
  EndpointInformation *local_58;
  EndpointInformation *local_50;
  EndpointInformation *local_38;
  undefined8 local_30;
  EndpointInformation *local_28;
  EndpointInformation *local_20;
  EndpointInformation *local_18;
  undefined8 local_8;
  
  local_8 = in_RSI;
  bVar1 = std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
          empty(in_RDI);
  if (!bVar1) {
    local_20 = (EndpointInformation *)
               std::
               vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
               begin(in_stack_ffffffffffffff28);
    local_28 = (EndpointInformation *)
               std::
               vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
               end(in_stack_ffffffffffffff28);
    local_30 = local_8;
    local_18 = (EndpointInformation *)
               std::
               remove_if<__gnu_cxx::__normal_iterator<helics::EndpointInformation*,std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>>,helics::EndpointInfo::removeTarget(helics::GlobalHandle)::__0>
                         (in_stack_ffffffffffffff58._M_current,in_stack_ffffffffffffff50,
                          (anon_class_8_1_cd94800a_for__M_pred)in_stack_ffffffffffffff48);
    local_38 = (EndpointInformation *)
               std::
               vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
               end(in_stack_ffffffffffffff28);
    bVar1 = __gnu_cxx::
            operator==<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                      ((__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                        *)in_stack_ffffffffffffff28);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      __args = (GlobalHandle *)(in_RDI + 10);
      __gnu_cxx::
      __normal_iterator<helics::EndpointInformation_const*,std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>>
      ::__normal_iterator<helics::EndpointInformation*>
                ((__normal_iterator<const_helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                  *)in_stack_ffffffffffffff30,
                 (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                  *)in_stack_ffffffffffffff28);
      local_50 = (EndpointInformation *)
                 std::
                 vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
                 end(in_stack_ffffffffffffff28);
      __gnu_cxx::
      __normal_iterator<helics::EndpointInformation_const*,std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>>
      ::__normal_iterator<helics::EndpointInformation*>
                ((__normal_iterator<const_helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                  *)in_stack_ffffffffffffff30,
                 (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                  *)in_stack_ffffffffffffff28);
      local_58 = (EndpointInformation *)
                 std::
                 vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
                 erase((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                        *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff58,
                       in_stack_ffffffffffffff50._M_current);
      std::
      vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::clear((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               *)0x4f627e);
      local_60 = in_RDI + 10;
      local_68._M_current =
           (EndpointInformation *)
           std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
           begin(in_stack_ffffffffffffff28);
      std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::end
                (in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::
                     operator==<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                               ((__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                                 *)in_stack_ffffffffffffff30,
                                (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                                 *)in_stack_ffffffffffffff28), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
        ::operator*(&local_68);
        std::
        vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
        ::emplace_back<helics::GlobalHandle_const&,std::__cxx11::string_const&>
                  ((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    *)in_RDI,__args,in_stack_ffffffffffffff30);
        __gnu_cxx::
        __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
        ::operator++(&local_68);
      }
    }
  }
  bVar1 = std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
          empty(in_RDI);
  if (!bVar1) {
    std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::begin
              (in_stack_ffffffffffffff28);
    std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::end
              (in_stack_ffffffffffffff28);
    std::
    remove_if<__gnu_cxx::__normal_iterator<helics::EndpointInformation*,std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>>,helics::EndpointInfo::removeTarget(helics::GlobalHandle)::__1>
              ((__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                )in_stack_ffffffffffffff58._M_current,in_stack_ffffffffffffff50,
               (anon_class_8_1_cd94800a_for__M_pred)in_stack_ffffffffffffff48);
    this_00 = in_RDI + 9;
    __gnu_cxx::
    __normal_iterator<helics::EndpointInformation_const*,std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>>
    ::__normal_iterator<helics::EndpointInformation*>
              ((__normal_iterator<const_helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                *)this_00,
               (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                *)in_stack_ffffffffffffff28);
    __last = std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
             ::end(in_stack_ffffffffffffff28);
    __gnu_cxx::
    __normal_iterator<helics::EndpointInformation_const*,std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>>
    ::__normal_iterator<helics::EndpointInformation*>
              ((__normal_iterator<const_helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                *)this_00,
               (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                *)in_stack_ffffffffffffff28);
    std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::erase
              ((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *)
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff58,(const_iterator)__last._M_current
              );
  }
  return;
}

Assistant:

void EndpointInfo::removeTarget(GlobalHandle targetId)
{
    if (!targetInformation.empty()) {
        auto removeIterator = std::remove_if(targetInformation.begin(),
                                             targetInformation.end(),
                                             [targetId](const auto& targetInfo) {
                                                 return targetInfo.id == targetId;
                                             });
        if (removeIterator != targetInformation.end()) {
            targetInformation.erase(removeIterator, targetInformation.end());
            targets.clear();
            for (const auto& targetInfo : targetInformation) {
                targets.emplace_back(targetInfo.id, targetInfo.key);
            }
        }
    }
    if (!sourceInformation.empty()) {
        auto removeIterator =
            std::remove_if(sourceInformation.begin(),
                           sourceInformation.end(),
                           [targetId](const auto& sinfo) { return sinfo.id == targetId; });
        sourceInformation.erase(removeIterator, sourceInformation.end());
    }
}